

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.c
# Opt level: O2

int transform_wrapper(CManager cm,_event_item *event,void *client_data,attr_list attrs,int out_count
                     ,int *out_stones)

{
  long lVar1;
  code *pcVar2;
  undefined8 uVar3;
  uint uVar4;
  __pid_t _Var5;
  int iVar6;
  void *__s;
  attr_list attrs_00;
  pthread_t pVar7;
  FILE *pFVar8;
  CManager local_a8;
  _event_item *local_a0;
  undefined8 local_98;
  int local_90;
  int *local_88;
  _EVSource s;
  
  __s = INT_CMmalloc((long)*(int *)((long)client_data + 0x28));
  lVar1 = *(long *)((long)client_data + 0x20);
  attrs_00 = (attr_list)create_attr_list();
  local_98 = *(undefined8 *)((long)client_data + 4);
  pFVar8 = (FILE *)cm->CMTrace_file;
  local_a8 = cm;
  local_a0 = event;
  local_90 = out_count;
  local_88 = out_stones;
  if (pFVar8 == (FILE *)0x0) {
    iVar6 = CMtrace_init(cm,EVerbose);
    if (iVar6 != 0) {
      pFVar8 = (FILE *)cm->CMTrace_file;
      goto LAB_00136383;
    }
  }
  else if (CMtrace_val[10] != 0) {
LAB_00136383:
    fwrite("Input Transform Event is :\n",0x1b,1,pFVar8);
    if (event->reference_format == (FMFormat)0x0) {
      fwrite("       ****  UNFORMATTED  ****\n",0x1f,1,(FILE *)cm->CMTrace_file);
    }
    else {
      FMfdump_data((FILE *)cm->CMTrace_file,event->reference_format,event->decoded_event,0x2800);
    }
  }
  memset(__s,0,(long)*(int *)((long)client_data + 0x28));
  if (lVar1 == 0) {
    uVar4 = (**(code **)((long)client_data + 0x10))(event->decoded_event,__s,attrs,attrs_00);
  }
  else {
    pcVar2 = (code *)**(undefined8 **)((long)client_data + 0x18);
    cod_assoc_client_data(lVar1,0x34567890,&local_a8);
    uVar4 = (*pcVar2)(lVar1,event->decoded_event,__s,attrs,attrs_00);
  }
  if (uVar4 != 0) {
    if (*out_stones != -1) {
      pFVar8 = (FILE *)cm->CMTrace_file;
      if (pFVar8 == (FILE *)0x0) {
        iVar6 = CMtrace_init(cm,EVerbose);
        if (iVar6 != 0) {
          pFVar8 = (FILE *)cm->CMTrace_file;
          goto LAB_00136563;
        }
      }
      else if (CMtrace_val[10] != 0) {
LAB_00136563:
        uVar3 = *(undefined8 *)((long)client_data + 0x38);
        fprintf(pFVar8," Transform function returned %d, submitting further\n",(ulong)uVar4);
        FMfdump_data(cm->CMTrace_file,uVar3,__s,0x2800);
      }
      s.local_stone_id = *out_stones;
      s.format = (CMFormat)0x0;
      s.reference_format = *(FMFormat *)((long)client_data + 0x38);
      s.free_func = transform_free_wrapper;
      s.preencoded = 0;
      s.cm = cm;
      s.free_data = s.reference_format;
      INT_EVsubmit(&s,__s,attrs_00);
      goto LAB_001365d2;
    }
    puts("Transform output stone ID not set, event discarded");
  }
  iVar6 = CMtrace_val[10];
  if (cm->CMTrace_file == (FILE *)0x0) {
    iVar6 = CMtrace_init(cm,EVerbose);
  }
  if (iVar6 != 0) {
    if (CMtrace_PID != 0) {
      pFVar8 = (FILE *)cm->CMTrace_file;
      _Var5 = getpid();
      pVar7 = pthread_self();
      fprintf(pFVar8,"P%lxT%lx - ",(long)_Var5,pVar7);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,(timespec *)&s);
      fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",s.cm,s.format);
    }
    fprintf((FILE *)cm->CMTrace_file,"Transform function returned %d, NOT submitting\n",0);
  }
  fflush((FILE *)cm->CMTrace_file);
  transform_free_wrapper(__s,*(void **)((long)client_data + 0x38));
  uVar4 = 0;
LAB_001365d2:
  free_attr_list(attrs_00);
  return uVar4;
}

Assistant:

static int
transform_wrapper(CManager cm, struct _event_item *event, void *client_data,
		  attr_list attrs, int out_count, int *out_stones)
{
    response_instance instance = (response_instance)client_data;
    int ret;
    void *out_event = malloc(instance->u.transform.out_size);
    int(*func)(cod_exec_context, void *, void*, attr_list, attr_list) = NULL;
    cod_exec_context ec = instance->u.transform.ec;
    struct ev_state_data ev_state;
    attr_list output_attrs = create_attr_list();

    ev_state.cm = cm;
    ev_state.cur_event = event;
    ev_state.stone = instance->stone;
    ev_state.proto_action_id = instance->proto_action_id;
    ev_state.out_count = out_count;
    ev_state.out_stones = out_stones;

    if (CMtrace_on(cm, EVerbose)) {
	fprintf(cm->CMTrace_file, "Input Transform Event is :\n");
	if (event->reference_format) {
	    FMfdump_data(cm->CMTrace_file, event->reference_format, event->decoded_event, 10240);
	} else {
	    fprintf(cm->CMTrace_file, "       ****  UNFORMATTED  ****\n");
	}
    }
    memset(out_event, 0, instance->u.transform.out_size);
    if (ec != NULL) {
#ifdef HAVE_COD_H
	func = (int(*)(cod_exec_context, void *, void*, attr_list, attr_list))instance->u.transform.code->func;
	cod_assoc_client_data(ec, 0x34567890, (intptr_t)&ev_state);
	ret = func(ec, event->decoded_event, out_event, attrs, output_attrs);
#endif
    } else {
	/* DLL-based handler */
	ret = ((int(*)(void *, void *, attr_list, attr_list))instance->u.transform.func_ptr)(event->decoded_event, out_event, attrs, output_attrs);
    }

    if (ret && (out_stones[0] == -1)) {
	printf("Transform output stone ID not set, event discarded\n");
	ret = 0;
    }
    if (ret) {
	struct _EVSource s;
	if (CMtrace_on(cm, EVerbose)) {
	    FMFormat f = instance->u.transform.out_format;
	    fprintf(cm->CMTrace_file, " Transform function returned %d, submitting further\n", ret);
	    FMfdump_data(cm->CMTrace_file, f, out_event, 10240);
	}
	s.local_stone_id = out_stones[0];
	s.cm = cm;
	s.format = NULL;
	s.reference_format = instance->u.transform.out_format;
	s.free_func = transform_free_wrapper;
	s.free_data = instance->u.transform.out_format;
	s.preencoded = 0;
	INT_EVsubmit(&s, out_event, output_attrs);
    } else {
	CMtrace_out(cm, EVerbose, "Transform function returned %d, NOT submitting\n", ret);
	transform_free_wrapper(out_event, instance->u.transform.out_format);
    }
    free_attr_list(output_attrs);
    return ret;
}